

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink.h
# Opt level: O0

void __thiscall
spdlog::sinks::base_sink<std::mutex>::set_pattern_(base_sink<std::mutex> *this,string *pattern)

{
  undefined1 local_28 [8];
  unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> local_20;
  undefined1 local_18 [8];
  string *pattern_local;
  base_sink<std::mutex> *this_local;
  
  local_18 = (undefined1  [8])pattern;
  pattern_local = (string *)this;
  std::make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>>::
  unique_ptr<spdlog::pattern_formatter,std::default_delete<spdlog::pattern_formatter>,void>
            ((unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>> *)&local_20,
             (unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
              *)local_28);
  (*(this->super_sink)._vptr_sink[9])
            (this,(unique_ptr<spdlog::formatter,std::default_delete<spdlog::formatter>> *)&local_20)
  ;
  std::unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_>::~unique_ptr
            (&local_20);
  std::unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>::
  ~unique_ptr((unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_>
               *)local_28);
  return;
}

Assistant:

virtual void set_pattern_(const std::string &pattern)
    {
        set_formatter_(details::make_unique<spdlog::pattern_formatter>(pattern));
    }